

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O1

bool __thiscall
cbtPolyhedralConvexShape::initializePolyhedralFeatures
          (cbtPolyhedralConvexShape *this,int shiftVerticesByMargin)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtVector3 *ptr;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  cbtConvexPolyhedron *pcVar9;
  cbtVector3 *pcVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  Edge *pEVar17;
  long lVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [64];
  float fVar23;
  cbtAlignedObjectArray<cbtVector3> shiftedPlaneEquations;
  cbtAlignedObjectArray<cbtVector3> orgVertices;
  cbtAlignedObjectArray<cbtVector3> tmpVertices;
  cbtAlignedObjectArray<cbtVector3> planeEquations;
  cbtConvexHullComputer conv;
  cbtFace local_150;
  float local_11c;
  cbtAlignedObjectArray<cbtVector3> local_118;
  cbtPolyhedralConvexShape *local_f8;
  long local_f0;
  cbtAlignedObjectArray<cbtVector3> local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  float local_b0;
  cbtConvexHullComputer local_90;
  
  if (this->m_polyhedron != (cbtConvexPolyhedron *)0x0) {
    (**this->m_polyhedron->_vptr_cbtConvexPolyhedron)();
    cbtAlignedFreeInternal(this->m_polyhedron);
  }
  pcVar9 = (cbtConvexPolyhedron *)cbtAlignedAllocInternal(0xb0,0x10);
  cbtConvexPolyhedron::cbtConvexPolyhedron(pcVar9);
  this->m_polyhedron = pcVar9;
  local_118.m_ownsMemory = true;
  uVar13 = 0;
  local_118.m_data = (cbtVector3 *)0x0;
  local_118.m_size = 0;
  local_118.m_capacity = 0;
  local_f8 = this;
  while( true ) {
    iVar7 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
              _vptr_cbtCollisionShape[0x19])(this);
    if (iVar7 <= (int)uVar13) break;
    lVar18 = (long)local_118.m_size;
    if (local_118.m_size == local_118.m_capacity) {
      iVar7 = local_118.m_size * 2;
      if (local_118.m_size == 0) {
        iVar7 = 1;
      }
      if (local_118.m_capacity < iVar7) {
        if (iVar7 == 0) {
          pcVar10 = (cbtVector3 *)0x0;
        }
        else {
          pcVar10 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar7 << 4,0x10);
        }
        if (0 < (long)local_118.m_size) {
          lVar12 = 0;
          do {
            puVar1 = (undefined8 *)((long)(local_118.m_data)->m_floats + lVar12);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)((long)pcVar10->m_floats + lVar12);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            lVar12 = lVar12 + 0x10;
          } while ((long)local_118.m_size * 0x10 != lVar12);
        }
        if ((local_118.m_data != (cbtVector3 *)0x0) && (local_118.m_ownsMemory == true)) {
          cbtAlignedFreeInternal(local_118.m_data);
        }
        local_118.m_ownsMemory = true;
        this = local_f8;
        local_118.m_data = pcVar10;
        local_118.m_capacity = iVar7;
      }
    }
    local_118.m_size = local_118.m_size + 1;
    (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1c])(this,uVar13,local_118.m_data + lVar18);
    uVar13 = (ulong)((int)uVar13 + 1);
  }
  local_90.vertices.m_ownsMemory = true;
  local_90.vertices.m_data = (cbtVector3 *)0x0;
  local_90.vertices.m_size = 0;
  local_90.vertices.m_capacity = 0;
  local_90.edges.m_ownsMemory = true;
  local_90.edges.m_data = (Edge *)0x0;
  local_90.edges.m_size = 0;
  local_90.edges.m_capacity = 0;
  local_90.faces.m_ownsMemory = true;
  local_90.faces.m_data = (int *)0x0;
  local_90.faces.m_size = 0;
  local_90.faces.m_capacity = 0;
  if (shiftVerticesByMargin == 0) {
    cbtConvexHullComputer::compute(&local_90,local_118.m_data,false,0x10,local_118.m_size,0.0,0.0);
  }
  else {
    local_b0 = (float)CONCAT31(local_b0._1_3_,1);
    local_b8 = (cbtVector3 *)0x0;
    local_c8._4_4_ = 0;
    local_c8._8_4_ = 0;
    cbtGeometryUtil::getPlaneEquationsFromVertices
              (&local_118,(cbtAlignedObjectArray<cbtVector3> *)local_c8);
    local_150.m_indices.m_ownsMemory = true;
    local_150.m_indices.m_data = (int *)0x0;
    local_150.m_indices.m_size = 0;
    local_150.m_indices.m_capacity = 0;
    if (0 < (int)local_c8._4_4_) {
      lVar18 = 0;
      do {
        local_e8._0_4_ = SUB84(*(undefined8 *)local_b8[lVar18].m_floats,0);
        local_e8.m_size = (int)((ulong)*(undefined8 *)local_b8[lVar18].m_floats >> 0x20);
        local_e8.m_capacity = (int)local_b8[lVar18].m_floats[2];
        fVar23 = local_b8[lVar18].m_floats[3];
        fVar21 = fVar23;
        (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
          _vptr_cbtCollisionShape[0xc])(this);
        if (local_150.m_indices.m_size == local_150.m_indices.m_capacity) {
          iVar7 = local_150.m_indices.m_size * 2;
          if (local_150.m_indices.m_size == 0) {
            iVar7 = 1;
          }
          if (local_150.m_indices.m_capacity < iVar7) {
            if (iVar7 == 0) {
              piVar11 = (int *)0x0;
            }
            else {
              piVar11 = (int *)cbtAlignedAllocInternal((long)iVar7 << 4,0x10);
            }
            if (0 < (long)local_150.m_indices.m_size) {
              lVar12 = 0;
              do {
                uVar6 = ((undefined8 *)((long)local_150.m_indices.m_data + lVar12))[1];
                *(undefined8 *)((long)piVar11 + lVar12) =
                     *(undefined8 *)((long)local_150.m_indices.m_data + lVar12);
                ((undefined8 *)((long)piVar11 + lVar12))[1] = uVar6;
                lVar12 = lVar12 + 0x10;
              } while ((long)local_150.m_indices.m_size * 0x10 != lVar12);
            }
            if ((local_150.m_indices.m_data != (int *)0x0) &&
               (local_150.m_indices.m_ownsMemory == true)) {
              cbtAlignedFreeInternal(local_150.m_indices.m_data);
            }
            local_150.m_indices.m_ownsMemory = true;
            local_150.m_indices.m_capacity = iVar7;
            local_150.m_indices.m_data = piVar11;
          }
        }
        lVar12 = (long)local_150.m_indices.m_size;
        local_150.m_indices.m_data[lVar12 * 4 + 2] = local_e8.m_capacity;
        *(ulong *)(local_150.m_indices.m_data + lVar12 * 4) =
             CONCAT44(local_e8.m_size,local_e8._0_4_);
        local_150.m_indices.m_data[lVar12 * 4 + 3] = (int)(fVar23 - fVar21);
        local_150.m_indices.m_size = local_150.m_indices.m_size + 1;
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)local_c8._4_4_);
    }
    local_e8.m_ownsMemory = true;
    local_e8.m_data = (cbtVector3 *)0x0;
    local_e8.m_size = 0;
    local_e8.m_capacity = 0;
    cbtGeometryUtil::getVerticesFromPlaneEquations
              ((cbtAlignedObjectArray<cbtVector3> *)&local_150,&local_e8);
    cbtConvexHullComputer::compute(&local_90,local_e8.m_data,false,0x10,local_e8.m_size,0.0,0.0);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_e8);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtVector3> *)&local_150);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtVector3> *)local_c8);
  }
  iVar7 = local_90.vertices.m_size;
  uVar13 = local_90.vertices._4_8_ & 0xffffffff;
  pcVar9 = this->m_polyhedron;
  if (((pcVar9->m_vertices).m_size < local_90.vertices.m_size) &&
     ((pcVar9->m_vertices).m_capacity < local_90.vertices.m_size)) {
    if (local_90.vertices.m_size == 0) {
      pcVar10 = (cbtVector3 *)0x0;
    }
    else {
      pcVar10 = (cbtVector3 *)cbtAlignedAllocInternal((long)local_90.vertices.m_size << 4,0x10);
    }
    lVar18 = (long)(pcVar9->m_vertices).m_size;
    if (0 < lVar18) {
      lVar12 = 0;
      do {
        puVar1 = (undefined8 *)((long)((pcVar9->m_vertices).m_data)->m_floats + lVar12);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar10->m_floats + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar12 = lVar12 + 0x10;
      } while (lVar18 * 0x10 != lVar12);
    }
    ptr = (pcVar9->m_vertices).m_data;
    if (ptr != (cbtVector3 *)0x0) {
      if ((pcVar9->m_vertices).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr);
      }
      (pcVar9->m_vertices).m_data = (cbtVector3 *)0x0;
    }
    (pcVar9->m_vertices).m_ownsMemory = true;
    (pcVar9->m_vertices).m_data = pcVar10;
    (pcVar9->m_vertices).m_capacity = iVar7;
  }
  (pcVar9->m_vertices).m_size = iVar7;
  if (0 < iVar7) {
    lVar18 = 0;
    do {
      puVar1 = (undefined8 *)((long)(local_90.vertices.m_data)->m_floats + lVar18);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)((this->m_polyhedron->m_vertices).m_data)->m_floats + lVar18);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar18 = lVar18 + 0x10;
    } while (uVar13 << 4 != lVar18);
  }
  if (0 < local_90.faces.m_size) {
    lVar18 = 0;
    do {
      local_150.m_indices.m_ownsMemory = true;
      local_150.m_indices.m_data = (int *)0x0;
      local_150.m_indices.m_size = 0;
      local_150.m_indices.m_capacity = 0;
      pEVar17 = local_90.edges.m_data + local_90.faces.m_data[lVar18];
      iVar7 = pEVar17[pEVar17->reverse].targetVertex;
      piVar11 = (int *)cbtAlignedAllocInternal(4,0x10);
      if (0 < (long)local_150.m_indices.m_size) {
        lVar12 = 0;
        do {
          piVar11[lVar12] = local_150.m_indices.m_data[lVar12];
          lVar12 = lVar12 + 1;
        } while (local_150.m_indices.m_size != lVar12);
      }
      if ((local_150.m_indices.m_data != (int *)0x0) && (local_150.m_indices.m_ownsMemory == true))
      {
        cbtAlignedFreeInternal(local_150.m_indices.m_data);
      }
      local_150.m_indices.m_ownsMemory = true;
      piVar11[local_150.m_indices.m_size] = iVar7;
      local_150.m_indices.m_capacity = 1;
      local_150.m_indices.m_size = local_150.m_indices.m_size + 1;
      local_150.m_indices.m_data = piVar11;
      local_f0 = lVar18;
      if (pEVar17->targetVertex != iVar7) {
        uVar13 = 0;
        iVar16 = pEVar17->targetVertex;
        iVar15 = iVar7;
        do {
          iVar8 = iVar16;
          fVar23 = local_90.vertices.m_data[iVar8].m_floats[0] -
                   local_90.vertices.m_data[iVar15].m_floats[0];
          fVar21 = local_90.vertices.m_data[iVar8].m_floats[1] -
                   local_90.vertices.m_data[iVar15].m_floats[1];
          fVar3 = local_90.vertices.m_data[iVar8].m_floats[2] -
                  local_90.vertices.m_data[iVar15].m_floats[2];
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),ZEXT416((uint)fVar23),
                                    ZEXT416((uint)fVar23));
          auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
          if (auVar19._0_4_ < 0.0) {
            local_11c = fVar3;
            fVar20 = sqrtf(auVar19._0_4_);
            fVar3 = local_11c;
          }
          else {
            auVar19 = vsqrtss_avx(auVar19,auVar19);
            fVar20 = auVar19._0_4_;
          }
          uVar14 = 2;
          if ((int)uVar13 < 2) {
            fVar20 = 1.0 / fVar20;
            auVar19 = vinsertps_avx(ZEXT416((uint)(fVar23 * fVar20)),
                                    ZEXT416((uint)(fVar21 * fVar20)),0x10);
            auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar3 * fVar20)),0x28);
            uVar14 = (int)uVar13 + 1;
            *(undefined1 (*) [16])(local_c8 + uVar13 * 0x10) = auVar19;
          }
          uVar13 = (ulong)uVar14;
          if (local_150.m_indices.m_size == local_150.m_indices.m_capacity) {
            iVar16 = local_150.m_indices.m_size * 2;
            if (local_150.m_indices.m_size == 0) {
              iVar16 = 1;
            }
            if (local_150.m_indices.m_capacity < iVar16) {
              if (iVar16 == 0) {
                piVar11 = (int *)0x0;
              }
              else {
                piVar11 = (int *)cbtAlignedAllocInternal((long)iVar16 << 2,0x10);
              }
              if (0 < (long)local_150.m_indices.m_size) {
                lVar18 = 0;
                do {
                  piVar11[lVar18] = local_150.m_indices.m_data[lVar18];
                  lVar18 = lVar18 + 1;
                } while (local_150.m_indices.m_size != lVar18);
              }
              if ((local_150.m_indices.m_data != (int *)0x0) &&
                 (local_150.m_indices.m_ownsMemory == true)) {
                cbtAlignedFreeInternal(local_150.m_indices.m_data);
              }
              local_150.m_indices.m_ownsMemory = true;
              local_150.m_indices.m_capacity = iVar16;
              local_150.m_indices.m_data = piVar11;
            }
          }
          local_150.m_indices.m_data[local_150.m_indices.m_size] = iVar8;
          local_150.m_indices.m_size = local_150.m_indices.m_size + 1;
          pEVar17 = pEVar17 + pEVar17->reverse + pEVar17[pEVar17->reverse].next;
          iVar16 = pEVar17->targetVertex;
          iVar15 = iVar8;
        } while (pEVar17->targetVertex != iVar7);
      }
      auVar4 = vfmsub231ss_fma(ZEXT416((uint)(local_b8._4_4_ * (float)local_c8._8_4_)),
                               ZEXT416((uint)local_c8._4_4_),ZEXT416((uint)local_b0));
      auVar19 = vfmsub231ss_fma(ZEXT416((uint)(local_b0 * (float)local_c8._0_4_)),
                                ZEXT416((uint)(float)local_b8),ZEXT416((uint)local_c8._8_4_));
      fVar23 = auVar19._0_4_;
      auVar5 = vfmsub231ss_fma(ZEXT416((uint)((float)local_b8 * (float)local_c8._4_4_)),
                               ZEXT416((uint)local_c8._0_4_),ZEXT416((uint)local_b8._4_4_));
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar4,auVar4);
      auVar19 = vfmadd231ss_fma(auVar19,auVar5,auVar5);
      if (auVar19._0_4_ < 0.0) {
        local_11c = auVar5._0_4_;
        fVar21 = sqrtf(auVar19._0_4_);
        local_150.m_plane[2] = local_11c;
      }
      else {
        auVar19 = vsqrtss_avx(auVar19,auVar19);
        fVar21 = auVar19._0_4_;
        local_150.m_plane[2] = auVar5._0_4_;
      }
      lVar18 = local_f0;
      this = local_f8;
      fVar21 = 1.0 / fVar21;
      local_150.m_plane[0] = auVar4._0_4_ * fVar21;
      local_150.m_plane[1] = fVar21 * fVar23;
      local_150.m_plane[2] = local_150.m_plane[2] * fVar21;
      auVar19 = SUB6416(ZEXT464(0x7149f2ca),0);
      if (0 < (long)local_150.m_indices.m_size) {
        pcVar10 = (local_f8->m_polyhedron->m_vertices).m_data;
        lVar12 = 0;
        auVar22 = ZEXT464(0x7149f2ca);
        do {
          iVar7 = local_150.m_indices.m_data[lVar12];
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_150.m_plane[1] * pcVar10[iVar7].m_floats[1]
                                                  )),ZEXT416((uint)local_150.m_plane[0]),
                                    ZEXT416((uint)pcVar10[iVar7].m_floats[0]));
          auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_150.m_plane[2]),
                                    ZEXT416((uint)pcVar10[iVar7].m_floats[2]));
          auVar19 = vminss_avx(auVar19,auVar22._0_16_);
          auVar22 = ZEXT1664(auVar19);
          lVar12 = lVar12 + 1;
        } while (local_150.m_indices.m_size != lVar12);
      }
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar19 = vxorps_avx512vl(auVar19,auVar4);
      local_150.m_plane[3] = auVar19._0_4_;
      cbtAlignedObjectArray<cbtFace>::push_back(&local_f8->m_polyhedron->m_faces,&local_150);
      cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_150.m_indices);
      lVar18 = lVar18 + 1;
    } while (lVar18 < local_90.faces.m_size);
  }
  cbtConvexPolyhedron::initialize(this->m_polyhedron);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_90.faces);
  cbtAlignedObjectArray<cbtConvexHullComputer::Edge>::~cbtAlignedObjectArray(&local_90.edges);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_90.vertices);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_118);
  return true;
}

Assistant:

bool cbtPolyhedralConvexShape::initializePolyhedralFeatures(int shiftVerticesByMargin)
{
	if (m_polyhedron)
	{
		m_polyhedron->~cbtConvexPolyhedron();
		cbtAlignedFree(m_polyhedron);
	}

	void* mem = cbtAlignedAlloc(sizeof(cbtConvexPolyhedron), 16);
	m_polyhedron = new (mem) cbtConvexPolyhedron;

	cbtAlignedObjectArray<cbtVector3> orgVertices;

	for (int i = 0; i < getNumVertices(); i++)
	{
		cbtVector3& newVertex = orgVertices.expand();
		getVertex(i, newVertex);
	}

	cbtConvexHullComputer conv;

	if (shiftVerticesByMargin)
	{
		cbtAlignedObjectArray<cbtVector3> planeEquations;
		cbtGeometryUtil::getPlaneEquationsFromVertices(orgVertices, planeEquations);

		cbtAlignedObjectArray<cbtVector3> shiftedPlaneEquations;
		for (int p = 0; p < planeEquations.size(); p++)
		{
			cbtVector3 plane = planeEquations[p];
			//	   cbtScalar margin = getMargin();
			plane[3] -= getMargin();
			shiftedPlaneEquations.push_back(plane);
		}

		cbtAlignedObjectArray<cbtVector3> tmpVertices;

		cbtGeometryUtil::getVerticesFromPlaneEquations(shiftedPlaneEquations, tmpVertices);

		conv.compute(&tmpVertices[0].getX(), sizeof(cbtVector3), tmpVertices.size(), 0.f, 0.f);
	}
	else
	{
		conv.compute(&orgVertices[0].getX(), sizeof(cbtVector3), orgVertices.size(), 0.f, 0.f);
	}

#ifndef BT_RECONSTRUCT_FACES

	int numVertices = conv.vertices.size();
	m_polyhedron->m_vertices.resize(numVertices);
	for (int p = 0; p < numVertices; p++)
	{
		m_polyhedron->m_vertices[p] = conv.vertices[p];
	}

	int v0, v1;
	for (int j = 0; j < conv.faces.size(); j++)
	{
		cbtVector3 edges[3];
		int numEdges = 0;
		cbtFace combinedFace;
		const cbtConvexHullComputer::Edge* edge = &conv.edges[conv.faces[j]];
		v0 = edge->getSourceVertex();
		int prevVertex = v0;
		combinedFace.m_indices.push_back(v0);
		v1 = edge->getTargetVertex();
		while (v1 != v0)
		{
			cbtVector3 wa = conv.vertices[prevVertex];
			cbtVector3 wb = conv.vertices[v1];
			cbtVector3 newEdge = wb - wa;
			newEdge.normalize();
			if (numEdges < 2)
				edges[numEdges++] = newEdge;

			//face->addIndex(v1);
			combinedFace.m_indices.push_back(v1);
			edge = edge->getNextEdgeOfFace();
			prevVertex = v1;
			int v01 = edge->getSourceVertex();
			v1 = edge->getTargetVertex();
		}

		cbtAssert(combinedFace.m_indices.size() > 2);

		cbtVector3 faceNormal = edges[0].cross(edges[1]);
		faceNormal.normalize();

		cbtScalar planeEq = 1e30f;

		for (int v = 0; v < combinedFace.m_indices.size(); v++)
		{
			cbtScalar eq = m_polyhedron->m_vertices[combinedFace.m_indices[v]].dot(faceNormal);
			if (planeEq > eq)
			{
				planeEq = eq;
			}
		}
		combinedFace.m_plane[0] = faceNormal.getX();
		combinedFace.m_plane[1] = faceNormal.getY();
		combinedFace.m_plane[2] = faceNormal.getZ();
		combinedFace.m_plane[3] = -planeEq;

		m_polyhedron->m_faces.push_back(combinedFace);
	}

#else  //BT_RECONSTRUCT_FACES

	cbtAlignedObjectArray<cbtVector3> faceNormals;
	int numFaces = conv.faces.size();
	faceNormals.resize(numFaces);
	cbtConvexHullComputer* convexUtil = &conv;

	cbtAlignedObjectArray<cbtFace> tmpFaces;
	tmpFaces.resize(numFaces);

	int numVertices = convexUtil->vertices.size();
	m_polyhedron->m_vertices.resize(numVertices);
	for (int p = 0; p < numVertices; p++)
	{
		m_polyhedron->m_vertices[p] = convexUtil->vertices[p];
	}

	for (int i = 0; i < numFaces; i++)
	{
		int face = convexUtil->faces[i];
		//printf("face=%d\n",face);
		const cbtConvexHullComputer::Edge* firstEdge = &convexUtil->edges[face];
		const cbtConvexHullComputer::Edge* edge = firstEdge;

		cbtVector3 edges[3];
		int numEdges = 0;
		//compute face normals

		do
		{
			int src = edge->getSourceVertex();
			tmpFaces[i].m_indices.push_back(src);
			int targ = edge->getTargetVertex();
			cbtVector3 wa = convexUtil->vertices[src];

			cbtVector3 wb = convexUtil->vertices[targ];
			cbtVector3 newEdge = wb - wa;
			newEdge.normalize();
			if (numEdges < 2)
				edges[numEdges++] = newEdge;

			edge = edge->getNextEdgeOfFace();
		} while (edge != firstEdge);

		cbtScalar planeEq = 1e30f;

		if (numEdges == 2)
		{
			faceNormals[i] = edges[0].cross(edges[1]);
			faceNormals[i].normalize();
			tmpFaces[i].m_plane[0] = faceNormals[i].getX();
			tmpFaces[i].m_plane[1] = faceNormals[i].getY();
			tmpFaces[i].m_plane[2] = faceNormals[i].getZ();
			tmpFaces[i].m_plane[3] = planeEq;
		}
		else
		{
			cbtAssert(0);  //degenerate?
			faceNormals[i].setZero();
		}

		for (int v = 0; v < tmpFaces[i].m_indices.size(); v++)
		{
			cbtScalar eq = m_polyhedron->m_vertices[tmpFaces[i].m_indices[v]].dot(faceNormals[i]);
			if (planeEq > eq)
			{
				planeEq = eq;
			}
		}
		tmpFaces[i].m_plane[3] = -planeEq;
	}

	//merge coplanar faces and copy them to m_polyhedron

	cbtScalar faceWeldThreshold = 0.999f;
	cbtAlignedObjectArray<int> todoFaces;
	for (int i = 0; i < tmpFaces.size(); i++)
		todoFaces.push_back(i);

	while (todoFaces.size())
	{
		cbtAlignedObjectArray<int> coplanarFaceGroup;
		int refFace = todoFaces[todoFaces.size() - 1];

		coplanarFaceGroup.push_back(refFace);
		cbtFace& faceA = tmpFaces[refFace];
		todoFaces.pop_back();

		cbtVector3 faceNormalA(faceA.m_plane[0], faceA.m_plane[1], faceA.m_plane[2]);
		for (int j = todoFaces.size() - 1; j >= 0; j--)
		{
			int i = todoFaces[j];
			cbtFace& faceB = tmpFaces[i];
			cbtVector3 faceNormalB(faceB.m_plane[0], faceB.m_plane[1], faceB.m_plane[2]);
			if (faceNormalA.dot(faceNormalB) > faceWeldThreshold)
			{
				coplanarFaceGroup.push_back(i);
				todoFaces.remove(i);
			}
		}

		bool did_merge = false;
		if (coplanarFaceGroup.size() > 1)
		{
			//do the merge: use Graham Scan 2d convex hull

			cbtAlignedObjectArray<GrahamVector3> orgpoints;
			cbtVector3 averageFaceNormal(0, 0, 0);

			for (int i = 0; i < coplanarFaceGroup.size(); i++)
			{
				//				m_polyhedron->m_faces.push_back(tmpFaces[coplanarFaceGroup[i]]);

				cbtFace& face = tmpFaces[coplanarFaceGroup[i]];
				cbtVector3 faceNormal(face.m_plane[0], face.m_plane[1], face.m_plane[2]);
				averageFaceNormal += faceNormal;
				for (int f = 0; f < face.m_indices.size(); f++)
				{
					int orgIndex = face.m_indices[f];
					cbtVector3 pt = m_polyhedron->m_vertices[orgIndex];

					bool found = false;

					for (int i = 0; i < orgpoints.size(); i++)
					{
						//if ((orgpoints[i].m_orgIndex == orgIndex) || ((rotatedPt-orgpoints[i]).length2()<0.0001))
						if (orgpoints[i].m_orgIndex == orgIndex)
						{
							found = true;
							break;
						}
					}
					if (!found)
						orgpoints.push_back(GrahamVector3(pt, orgIndex));
				}
			}

			cbtFace combinedFace;
			for (int i = 0; i < 4; i++)
				combinedFace.m_plane[i] = tmpFaces[coplanarFaceGroup[0]].m_plane[i];

			cbtAlignedObjectArray<GrahamVector3> hull;

			averageFaceNormal.normalize();
			GrahamScanConvexHull2D(orgpoints, hull, averageFaceNormal);

			for (int i = 0; i < hull.size(); i++)
			{
				combinedFace.m_indices.push_back(hull[i].m_orgIndex);
				for (int k = 0; k < orgpoints.size(); k++)
				{
					if (orgpoints[k].m_orgIndex == hull[i].m_orgIndex)
					{
						orgpoints[k].m_orgIndex = -1;  // invalidate...
						break;
					}
				}
			}

			// are there rejected vertices?
			bool reject_merge = false;

			for (int i = 0; i < orgpoints.size(); i++)
			{
				if (orgpoints[i].m_orgIndex == -1)
					continue;  // this is in the hull...
				// this vertex is rejected -- is anybody else using this vertex?
				for (int j = 0; j < tmpFaces.size(); j++)
				{
					cbtFace& face = tmpFaces[j];
					// is this a face of the current coplanar group?
					bool is_in_current_group = false;
					for (int k = 0; k < coplanarFaceGroup.size(); k++)
					{
						if (coplanarFaceGroup[k] == j)
						{
							is_in_current_group = true;
							break;
						}
					}
					if (is_in_current_group)  // ignore this face...
						continue;
					// does this face use this rejected vertex?
					for (int v = 0; v < face.m_indices.size(); v++)
					{
						if (face.m_indices[v] == orgpoints[i].m_orgIndex)
						{
							// this rejected vertex is used in another face -- reject merge
							reject_merge = true;
							break;
						}
					}
					if (reject_merge)
						break;
				}
				if (reject_merge)
					break;
			}

			if (!reject_merge)
			{
				// do this merge!
				did_merge = true;
				m_polyhedron->m_faces.push_back(combinedFace);
			}
		}
		if (!did_merge)
		{
			for (int i = 0; i < coplanarFaceGroup.size(); i++)
			{
				cbtFace face = tmpFaces[coplanarFaceGroup[i]];
				m_polyhedron->m_faces.push_back(face);
			}
		}
	}

#endif  //BT_RECONSTRUCT_FACES

	m_polyhedron->initialize();

	return true;
}